

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_StoreGetEntrySimple
              (Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  Ses_TruthEntry_t *pEntry;
  Ses_TimesEntry_t *pTimes2;
  uint uVar1;
  int iVar2;
  Ses_TruthEntry_t **ppSVar3;
  Ses_TimesEntry_t **ppSVar4;
  
  uVar1 = Ses_StoreTableHash(pTruth,nVars);
  ppSVar3 = pStore->pEntries + uVar1;
  while( true ) {
    pEntry = *ppSVar3;
    if (pEntry == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
    iVar2 = Ses_StoreTruthEqual(pEntry,pTruth,nVars);
    if (iVar2 != 0) break;
    ppSVar3 = &pEntry->next;
  }
  ppSVar4 = &pEntry->head;
  while( true ) {
    pTimes2 = *ppSVar4;
    if (pTimes2 == (Ses_TimesEntry_t *)0x0) {
      return 0;
    }
    iVar2 = Ses_StoreTimesEqual(pArrTimeProfile,pTimes2->pArrTimeProfile,nVars);
    if (iVar2 != 0) break;
    ppSVar4 = &pTimes2->next;
  }
  *pSol = pTimes2->pNetwork;
  return 1;
}

Assistant:

int Ses_StoreGetEntrySimple( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}